

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O1

PrimInfoMB *
embree::sse2::createPrimRefArrayMSMBlur
          (PrimInfoMB *__return_storage_ptr__,Scene *scene,GTypeMask types,size_t numPrimRefs,
          mvector<PrimRefMB> *prims,BuildProgressMonitor *progressMonitor,BBox1f t0t1)

{
  float fVar1;
  Geometry *pGVar2;
  unsigned_long uVar3;
  size_t sVar4;
  size_t sVar5;
  BBox1f BVar6;
  char cVar7;
  int iVar8;
  ulong uVar9;
  task *ptVar10;
  runtime_error *prVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  float *pfVar18;
  size_t sVar19;
  _func_int **pp_Var20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  float fVar37;
  float fVar38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar39;
  BBox1f BVar40;
  unsigned_long uVar41;
  unsigned_long uVar42;
  float fVar43;
  BBox1f BVar44;
  size_t taskCount;
  small_object_allocator alloc;
  Iterator2 iter;
  task_group_context context;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  undefined1 local_4e21;
  _func_int **local_4e20;
  BBox1f local_4e18;
  long **local_4e10;
  task_traits local_4e08;
  Scene *local_4e00;
  GTypeMask local_4df8;
  char local_4df0;
  mvector<PrimRefMB> *local_4de8;
  BuildProgressMonitor *local_4de0;
  size_t local_4dd8;
  mvector<PrimRefMB> *local_4dd0;
  BBox1f *local_4dc8;
  mvector<PrimRefMB> **local_4dc0;
  Scene **local_4db8;
  Scene **local_4db0;
  undefined8 local_4da8;
  undefined8 uStack_4da0;
  undefined8 local_4d98;
  undefined8 uStack_4d90;
  undefined8 local_4d88;
  undefined8 uStack_4d80;
  undefined8 local_4d78;
  undefined8 uStack_4d70;
  undefined8 local_4d68;
  undefined8 uStack_4d60;
  undefined8 local_4d58;
  undefined8 uStack_4d50;
  unsigned_long local_4d48;
  unsigned_long uStack_4d40;
  size_t local_4d38;
  size_t sStack_4d30;
  float local_4d28;
  float fStack_4d24;
  float fStack_4d20;
  float fStack_4d1c;
  long *local_4d18;
  _func_int ***local_4d10;
  undefined8 *local_4d08;
  Scene ***local_4d00;
  undefined1 *local_4cf8;
  mvector<PrimRefMB> ***local_4cf0;
  undefined8 local_4ce8;
  undefined4 local_4ce0;
  wait_context local_4cd8;
  task_group_context local_4cc8;
  long local_4c48 [64];
  ulong local_4a48 [64];
  _func_int **local_4848;
  ulong local_4840;
  undefined1 local_4838 [9356];
  float local_23ac [2271];
  
  local_4848 = (_func_int **)0x0;
  local_4df0 = '\x01';
  uVar23 = 0;
  local_4e18 = t0t1;
  local_4e00 = scene;
  local_4df8 = types;
  local_4de8 = prims;
  local_4de0 = progressMonitor;
  local_4dd8 = numPrimRefs;
  (**progressMonitor->_vptr_BuildProgressMonitor)();
  sVar15 = (local_4e00->geometries).size_active;
  if (sVar15 != 0) {
    uVar23 = 0;
    sVar19 = 0;
    do {
      pGVar2 = (local_4e00->geometries).items[sVar19].ptr;
      if ((((pGVar2 == (Geometry *)0x0) || (((uint)pGVar2->field_8 >> 0x15 & 1) == 0)) ||
          ((local_4df8 & 1 << (SUB41(pGVar2->field_8,0) & 0x1f)) == ~MTY_ALL)) ||
         ((bool)local_4df0 != (pGVar2->numTimeSteps != 1))) {
        uVar12 = 0;
      }
      else {
        uVar12 = (ulong)pGVar2->numPrimitives;
      }
      uVar23 = uVar23 + uVar12;
      sVar19 = sVar19 + 1;
    } while (sVar15 != sVar19);
  }
  local_4840 = uVar23;
  iVar8 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar12 = uVar23 + 0x3ff >> 10;
  if ((ulong)(long)iVar8 < uVar12) {
    uVar12 = (long)iVar8;
  }
  uVar16 = 0x40;
  if (uVar12 < 0x40) {
    uVar16 = uVar12;
  }
  local_4848 = (_func_int **)(uVar16 + (uVar16 == 0));
  local_4c48[0] = 0;
  local_4a48[0] = 0;
  if (1 < uVar12) {
    uVar16 = 0;
    uVar12 = uVar23 / (ulong)local_4848;
    pp_Var20 = (_func_int **)0x1;
    lVar21 = 0;
    do {
      pGVar2 = (local_4e00->geometries).items[lVar21].ptr;
      if (((pGVar2 == (Geometry *)0x0) || (((uint)pGVar2->field_8 >> 0x15 & 1) == 0)) ||
         (((local_4df8 & 1 << (SUB41(pGVar2->field_8,0) & 0x1f)) == ~MTY_ALL ||
          ((bool)local_4df0 != (pGVar2->numTimeSteps != 1))))) {
        uVar24 = 0;
      }
      else {
        uVar24 = (ulong)pGVar2->numPrimitives;
      }
      if (uVar24 == 0) {
        lVar14 = 0;
      }
      else {
        uVar13 = ((long)pp_Var20 + 1) * uVar23;
        lVar14 = 0;
        uVar22 = 0;
        do {
          uVar9 = uVar12;
          uVar12 = uVar9;
          if ((uVar24 + uVar16 + lVar14 < uVar9) || (local_4848 <= pp_Var20)) break;
          local_4c48[(long)pp_Var20] = lVar21;
          uVar22 = uVar22 + (uVar9 - uVar16);
          local_4a48[(long)pp_Var20] = uVar22;
          pp_Var20 = (_func_int **)((long)pp_Var20 + 1);
          uVar12 = uVar13 / (ulong)local_4848;
          lVar14 = -uVar22;
          uVar13 = uVar13 + uVar23;
          uVar16 = uVar9;
        } while (uVar22 < uVar24);
      }
      uVar16 = uVar16 + uVar24 + lVar14;
      lVar21 = lVar21 + 1;
    } while (pp_Var20 < local_4848);
  }
  pp_Var20 = local_4848;
  local_4da8 = 0x7f8000007f800000;
  uStack_4da0 = 0x7f8000007f800000;
  local_4d98 = 0xff800000ff800000;
  uStack_4d90 = 0xff800000ff800000;
  local_4d88 = 0x7f8000007f800000;
  uStack_4d80 = 0x7f8000007f800000;
  local_4d78 = 0xff800000ff800000;
  uStack_4d70 = 0xff800000ff800000;
  local_4d68 = 0x7f8000007f800000;
  uStack_4d60 = 0x7f8000007f800000;
  local_4d58 = 0xff800000ff800000;
  uStack_4d50 = 0xff800000ff800000;
  local_4d48 = 0;
  uStack_4d40 = 0;
  local_4d38 = 0;
  sStack_4d30 = 0;
  local_4d28 = 0.0;
  fStack_4d24 = 1.0;
  fStack_4d20 = 1.0;
  fStack_4d1c = 0.0;
  local_4dc0 = &local_4dd0;
  local_4dd0 = local_4de8;
  local_4dc8 = &local_4e18;
  local_4db8 = &local_4e00;
  local_4cf0 = &local_4dc0;
  local_4d10 = &local_4e20;
  local_4d18 = local_4c48;
  local_4cf8 = &local_4e21;
  local_4cc8.my_version = proxy_support;
  local_4cc8.my_traits = (context_traits)0x4;
  local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_4cc8.my_name = CUSTOM_CTX;
  local_4e20 = local_4848;
  local_4db0 = local_4db8;
  local_4d08 = &local_4da8;
  local_4d00 = &local_4db0;
  tbb::detail::r1::initialize(&local_4cc8);
  local_4e10 = &local_4d18;
  if (pp_Var20 != (_func_int **)0x0) {
    local_4e08.m_version_and_traits = 0;
    ptVar10 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_4e08,0xc0);
    ptVar10->m_reserved[3] = 0;
    ptVar10->m_reserved[4] = 0;
    ptVar10->m_reserved[1] = 0;
    ptVar10->m_reserved[2] = 0;
    (ptVar10->super_task_traits).m_version_and_traits = 0;
    ptVar10->m_reserved[0] = 0;
    ptVar10->m_reserved[5] = 0;
    ptVar10->_vptr_task = (_func_int **)&PTR__task_02207008;
    ptVar10[1]._vptr_task = pp_Var20;
    ptVar10[1].super_task_traits.m_version_and_traits = 0;
    ptVar10[1].m_reserved[0] = 1;
    ptVar10[1].m_reserved[1] = (uint64_t)&local_4e10;
    ptVar10[1].m_reserved[2] = 0;
    ptVar10[1].m_reserved[3] = 1;
    iVar8 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)&ptVar10[2]._vptr_task = 0;
    *(undefined1 *)((long)&ptVar10[2]._vptr_task + 4) = 5;
    ptVar10[1].m_reserved[5] = ((long)iVar8 & 0x3fffffffffffffffU) * 2;
    ptVar10[2].super_task_traits.m_version_and_traits = local_4e08.m_version_and_traits;
    local_4ce8 = 0;
    local_4ce0 = 1;
    local_4cd8.m_version_and_traits = 1;
    local_4cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar10[1].m_reserved[4] = (uint64_t)&local_4ce8;
    tbb::detail::r1::execute_and_wait(ptVar10,&local_4cc8,&local_4cd8,&local_4cc8);
  }
  cVar7 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
  if (cVar7 != '\0') {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"task cancelled");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_4cc8);
  aVar26._8_8_ = uStack_4da0;
  aVar26._0_8_ = local_4da8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar26;
  aVar27._8_8_ = uStack_4d90;
  aVar27._0_8_ = local_4d98;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar27;
  aVar29._8_8_ = uStack_4d80;
  aVar29._0_8_ = local_4d88;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar29;
  aVar31._8_8_ = uStack_4d70;
  aVar31._0_8_ = local_4d78;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar31;
  aVar33._8_8_ = uStack_4d60;
  aVar33._0_8_ = local_4d68;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar33;
  aVar35._8_8_ = uStack_4d50;
  aVar35._0_8_ = local_4d58;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar35;
  (__return_storage_ptr__->object_range)._begin = local_4d48;
  (__return_storage_ptr__->object_range)._end = uStack_4d40;
  BVar40.upper = fStack_4d24;
  BVar40.lower = local_4d28;
  BVar6.upper = fStack_4d1c;
  BVar6.lower = fStack_4d20;
  __return_storage_ptr__->max_time_range = BVar40;
  __return_storage_ptr__->time_range = BVar6;
  __return_storage_ptr__->num_time_segments = local_4d38;
  __return_storage_ptr__->max_num_time_segments = sStack_4d30;
  if (local_4e20 != (_func_int **)0x0) {
    sVar15 = __return_storage_ptr__->num_time_segments;
    pauVar17 = (undefined1 (*) [16])local_4838;
    BVar40 = __return_storage_ptr__->max_time_range;
    uVar41 = (__return_storage_ptr__->object_range)._begin;
    uVar42 = (__return_storage_ptr__->object_range)._end;
    sVar19 = __return_storage_ptr__->max_num_time_segments;
    pp_Var20 = local_4e20;
    fVar43 = (__return_storage_ptr__->time_range).upper;
    fVar37 = (__return_storage_ptr__->time_range).lower;
    do {
      uVar12 = *(ulong *)(pauVar17[7] + 8);
      uVar23 = *(ulong *)pauVar17[8];
      fVar1 = *(float *)(pauVar17[8] + 0xc);
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar17 + 0x240) = aVar26;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar17 + 0x241) = aVar27;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar17 + 0x242) = aVar29;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar17 + 0x243) = aVar31;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar17 + 0x244) = aVar33;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar17 + 0x245) = aVar35;
      aVar26.m128 = (__m128)minps(aVar26.m128,*pauVar17);
      aVar27.m128 = (__m128)maxps(aVar27.m128,pauVar17[1]);
      aVar29.m128 = (__m128)minps(aVar29.m128,pauVar17[2]);
      aVar31.m128 = (__m128)maxps(aVar31.m128,pauVar17[3]);
      aVar33.m128 = (__m128)minps(aVar33.m128,pauVar17[4]);
      aVar35.m128 = (__m128)maxps(aVar35.m128,pauVar17[5]);
      fVar38 = fVar37;
      if (*(float *)(pauVar17[8] + 8) <= fVar37) {
        fVar38 = *(float *)(pauVar17[8] + 8);
      }
      sVar15 = sVar15 + *(long *)pauVar17[7];
      uVar3 = (__return_storage_ptr__->object_range)._end;
      sVar4 = __return_storage_ptr__->num_time_segments;
      sVar5 = __return_storage_ptr__->max_num_time_segments;
      *(unsigned_long *)pauVar17[0x246] = (__return_storage_ptr__->object_range)._begin;
      *(unsigned_long *)(pauVar17[0x246] + 8) = uVar3;
      *(size_t *)pauVar17[0x247] = sVar4;
      *(size_t *)(pauVar17[0x247] + 8) = sVar5;
      *(BBox1f *)(pauVar17 + 0x248) = BVar40;
      *(float *)(pauVar17[0x248] + 8) = fVar37;
      *(float *)(pauVar17[0x248] + 0xc) = fVar43;
      if (fVar1 <= fVar43) {
        fVar1 = fVar43;
      }
      uVar16 = CONCAT44((int)((uint)(sVar19 < uVar12) << 0x1f) >> 0x1f,
                        (int)((uint)(sVar19 < uVar12) << 0x1f) >> 0x1f);
      if (sVar19 <= uVar12) {
        sVar19 = uVar12;
      }
      BVar40 = (BBox1f)(~uVar16 & (ulong)BVar40 | uVar23 & uVar16);
      uVar41 = uVar41 + *(long *)pauVar17[6];
      uVar42 = uVar42 + *(long *)(pauVar17[6] + 8);
      (__return_storage_ptr__->object_range)._begin = uVar41;
      (__return_storage_ptr__->object_range)._end = uVar42;
      __return_storage_ptr__->num_time_segments = sVar15;
      __return_storage_ptr__->max_num_time_segments = sVar19;
      pauVar17 = pauVar17 + 9;
      pp_Var20 = (_func_int **)((long)pp_Var20 + -1);
      fVar43 = fVar1;
      fVar37 = fVar38;
    } while (pp_Var20 != (_func_int **)0x0);
    __return_storage_ptr__->max_time_range = BVar40;
    (__return_storage_ptr__->time_range).lower = fVar38;
    (__return_storage_ptr__->time_range).upper = fVar1;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar26;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar27;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar29;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar31;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar33;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar35;
  if ((__return_storage_ptr__->object_range)._end - (__return_storage_ptr__->object_range)._begin !=
      local_4dd8) {
    (**local_4de0->_vptr_BuildProgressMonitor)(local_4de0,0);
    pp_Var20 = local_4848;
    local_4da8 = 0x7f8000007f800000;
    uStack_4da0 = 0x7f8000007f800000;
    local_4d98 = 0xff800000ff800000;
    uStack_4d90 = 0xff800000ff800000;
    local_4d88 = 0x7f8000007f800000;
    uStack_4d80 = 0x7f8000007f800000;
    local_4d78 = 0xff800000ff800000;
    uStack_4d70 = 0xff800000ff800000;
    local_4d68 = 0x7f8000007f800000;
    uStack_4d60 = 0x7f8000007f800000;
    local_4d58 = 0xff800000ff800000;
    uStack_4d50 = 0xff800000ff800000;
    local_4d48 = 0;
    uStack_4d40 = 0;
    local_4d38 = 0;
    sStack_4d30 = 0;
    local_4d28 = 0.0;
    fStack_4d24 = 1.0;
    fStack_4d20 = 1.0;
    fStack_4d1c = 0.0;
    local_4dd0 = local_4de8;
    local_4dc8 = &local_4e18;
    local_4db8 = &local_4e00;
    local_4dc0 = &local_4dd0;
    local_4e20 = local_4848;
    local_4d18 = local_4c48;
    local_4d10 = &local_4e20;
    local_4cf8 = &local_4e21;
    local_4cc8.my_version = proxy_support;
    local_4cc8.my_traits = (context_traits)0x4;
    local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_4cc8.my_name = CUSTOM_CTX;
    local_4db0 = local_4db8;
    local_4d08 = &local_4da8;
    local_4d00 = &local_4db0;
    local_4cf0 = &local_4dc0;
    tbb::detail::r1::initialize(&local_4cc8);
    local_4e10 = &local_4d18;
    if (pp_Var20 != (_func_int **)0x0) {
      local_4e08.m_version_and_traits = 0;
      ptVar10 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_4e08,0xc0);
      ptVar10->m_reserved[3] = 0;
      ptVar10->m_reserved[4] = 0;
      ptVar10->m_reserved[1] = 0;
      ptVar10->m_reserved[2] = 0;
      (ptVar10->super_task_traits).m_version_and_traits = 0;
      ptVar10->m_reserved[0] = 0;
      ptVar10->m_reserved[5] = 0;
      ptVar10->_vptr_task = (_func_int **)&PTR__task_02207050;
      ptVar10[1]._vptr_task = pp_Var20;
      ptVar10[1].super_task_traits.m_version_and_traits = 0;
      ptVar10[1].m_reserved[0] = 1;
      ptVar10[1].m_reserved[1] = (uint64_t)&local_4e10;
      ptVar10[1].m_reserved[2] = 0;
      ptVar10[1].m_reserved[3] = 1;
      iVar8 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)&ptVar10[2]._vptr_task = 0;
      *(undefined1 *)((long)&ptVar10[2]._vptr_task + 4) = 5;
      ptVar10[1].m_reserved[5] = ((long)iVar8 & 0x3fffffffffffffffU) * 2;
      ptVar10[2].super_task_traits.m_version_and_traits = local_4e08.m_version_and_traits;
      local_4ce8 = 0;
      local_4ce0 = 1;
      local_4cd8.m_version_and_traits = 1;
      local_4cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)1;
      ptVar10[1].m_reserved[4] = (uint64_t)&local_4ce8;
      tbb::detail::r1::execute_and_wait(ptVar10,&local_4cc8,&local_4cd8,&local_4cc8);
    }
    cVar7 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
    if (cVar7 != '\0') {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"task cancelled");
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_4cc8);
    aVar39._8_8_ = uStack_4da0;
    aVar39._0_8_ = local_4da8;
    aVar36._8_8_ = uStack_4d90;
    aVar36._0_8_ = local_4d98;
    aVar34._8_8_ = uStack_4d80;
    aVar34._0_8_ = local_4d88;
    aVar32._8_8_ = uStack_4d70;
    aVar32._0_8_ = local_4d78;
    aVar30._8_8_ = uStack_4d60;
    aVar30._0_8_ = local_4d68;
    aVar28._8_8_ = uStack_4d50;
    aVar28._0_8_ = local_4d58;
    BVar44.upper = fStack_4d24;
    BVar44.lower = local_4d28;
    if (local_4e20 != (_func_int **)0x0) {
      pfVar18 = local_23ac;
      fVar43 = fStack_4d1c;
      do {
        uVar23 = *(ulong *)(pfVar18 + -0x905);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar18 + -0x23) = aVar39;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar18 + -0x1f) = aVar36;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar18 + -0x1b) = aVar34;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar18 + -0x17) = aVar32;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar18 + -0x13) = aVar30;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar18 + -0xf) = aVar28;
        *(unsigned_long *)(pfVar18 + -0xb) = local_4d48;
        *(unsigned_long *)(pfVar18 + -9) = uStack_4d40;
        *(size_t *)(pfVar18 + -7) = local_4d38;
        *(size_t *)(pfVar18 + -5) = sStack_4d30;
        *(BBox1f *)(pfVar18 + -3) = BVar44;
        pfVar18[-1] = fStack_4d20;
        *pfVar18 = fVar43;
        aVar39.m128 = (__m128)minps(aVar39.m128,*(undefined1 (*) [16])(pfVar18 + -0x923));
        aVar36.m128 = (__m128)maxps(aVar36.m128,*(undefined1 (*) [16])(pfVar18 + -0x91f));
        aVar34.m128 = (__m128)minps(aVar34.m128,*(undefined1 (*) [16])(pfVar18 + -0x91b));
        aVar32.m128 = (__m128)maxps(aVar32.m128,*(undefined1 (*) [16])(pfVar18 + -0x917));
        aVar30.m128 = (__m128)minps(aVar30.m128,*(undefined1 (*) [16])(pfVar18 + -0x913));
        aVar28.m128 = (__m128)maxps(aVar28.m128,*(undefined1 (*) [16])(pfVar18 + -0x90f));
        if (pfVar18[-0x901] <= fStack_4d20) {
          fStack_4d20 = pfVar18[-0x901];
        }
        local_4d48 = local_4d48 + *(long *)(pfVar18 + -0x90b);
        uStack_4d40 = uStack_4d40 + *(long *)(pfVar18 + -0x909);
        fStack_4d1c = pfVar18[-0x900];
        if (pfVar18[-0x900] <= fVar43) {
          fStack_4d1c = fVar43;
        }
        local_4d38 = local_4d38 + *(long *)(pfVar18 + -0x907);
        bVar25 = sStack_4d30 < uVar23;
        if (sStack_4d30 <= uVar23) {
          sStack_4d30 = uVar23;
        }
        uVar23 = CONCAT44((int)((uint)bVar25 << 0x1f) >> 0x1f,(int)((uint)bVar25 << 0x1f) >> 0x1f);
        BVar44 = (BBox1f)(~uVar23 & (ulong)BVar44 | *(ulong *)(pfVar18 + -0x903) & uVar23);
        pfVar18 = pfVar18 + 0x24;
        local_4e20 = (_func_int **)((long)local_4e20 + -1);
        fVar43 = fStack_4d1c;
      } while (local_4e20 != (_func_int **)0x0);
    }
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    lower.field_0 = aVar39;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    upper.field_0 = aVar36;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    lower.field_0 = aVar34;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    upper.field_0 = aVar32;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
    field_0 = aVar30;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
    field_0 = aVar28;
    (__return_storage_ptr__->object_range)._begin = local_4d48;
    (__return_storage_ptr__->object_range)._end = uStack_4d40;
    __return_storage_ptr__->num_time_segments = local_4d38;
    __return_storage_ptr__->max_num_time_segments = sStack_4d30;
    __return_storage_ptr__->max_time_range = BVar44;
    (__return_storage_ptr__->time_range).lower = fStack_4d20;
    (__return_storage_ptr__->time_range).upper = fStack_4d1c;
  }
  __return_storage_ptr__->time_range = local_4e18;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefArrayMSMBlur(Scene* scene, Geometry::GTypeMask types, const size_t numPrimRefs, mvector<PrimRefMB>& prims, BuildProgressMonitor& progressMonitor, BBox1f t0t1)
    {
      ParallelForForPrefixSumState<PrimInfoMB> pstate;
      Scene::Iterator2 iter(scene,types,true);
      
      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfoMB pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfoMB {
          return mesh->createPrimRefMBArray(prims,t0t1,r,k,(unsigned)geomID);
      }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB {
            return mesh->createPrimRefMBArray(prims,t0t1,r,base.size(),(unsigned)geomID);
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      }

      /* the BVH starts with that time range, even though primitives might have smaller/larger time range */
      pinfo.time_range = t0t1;
      return pinfo;
    }